

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# built_in_functions.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::BindExtensionFunction
          (ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  pointer puVar1;
  bool bVar2;
  ScalarFunctionInfo *pSVar3;
  type db;
  Catalog *this;
  ScalarFunctionCatalogEntry *pSVar4;
  BinderException *this_00;
  string *ext_name;
  allocator local_199;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  ScalarFunction local_158;
  
  pSVar3 = shared_ptr<duckdb::ScalarFunctionInfo,_true>::operator->
                     ((shared_ptr<duckdb::ScalarFunctionInfo,_true> *)
                      &arguments[0xb].
                       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ext_name = (string *)(pSVar3 + 1);
  db = shared_ptr<duckdb::DatabaseInstance,_true>::operator*
                 ((shared_ptr<duckdb::DatabaseInstance,_true> *)
                  &(bound_function->super_BaseScalarFunction).super_SimpleFunction.super_Function.
                   name._M_string_length);
  bVar2 = ExtensionHelper::CanAutoloadExtension(ext_name);
  if (bVar2) {
    ExtensionHelper::AutoLoadExtension(db,ext_name);
    this = Catalog::GetSystemCatalog(db);
    ::std::__cxx11::string::string((string *)&local_158,"main",&local_199);
    pSVar4 = Catalog::GetEntry<duckdb::ScalarFunctionCatalogEntry>
                       (this,(ClientContext *)bound_function,(string *)&local_158,
                        (string *)
                        &(arguments->
                         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         ).
                         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
                        (QueryErrorContext)0xffffffffffffffff);
    ::std::__cxx11::string::~string((string *)&local_158);
    ScalarFunctionSet::GetFunctionByArguments
              (&local_158,&pSVar4->functions,(ClientContext *)bound_function,
               (vector<duckdb::LogicalType,_true> *)(arguments + 3));
    ScalarFunction::operator=((ScalarFunction *)arguments,&local_158);
    ScalarFunction::~ScalarFunction(&local_158);
    puVar1 = arguments[8].
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (puVar1 == (pointer)0x0) {
      (context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
      super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
    }
    else {
      (*(code *)puVar1)(context,bound_function,arguments);
    }
    return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
           (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)context;
  }
  this_00 = (BinderException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_158,
             "Trying to call function \"%s\" which is present in extension \"%s\" - but the extension is not loaded and could not be auto-loaded"
             ,&local_199);
  ::std::__cxx11::string::string
            ((string *)&local_178,
             (string *)
             &(arguments->
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ).
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  ::std::__cxx11::string::string((string *)&local_198,(string *)ext_name);
  BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
            (this_00,(string *)&local_158,&local_178,&local_198);
  __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<FunctionData> BindExtensionFunction(ClientContext &context, ScalarFunction &bound_function,
                                               vector<unique_ptr<Expression>> &arguments) {
	// if this is triggered we are trying to call a method that is present in an extension
	// but the extension is not loaded
	// try to autoload the extension
	// first figure out which extension we need to auto-load
	auto &function_info = bound_function.function_info->Cast<ExtensionFunctionInfo>();
	auto &extension_name = function_info.extension;
	auto &db = *context.db;

	if (!ExtensionHelper::CanAutoloadExtension(extension_name)) {
		throw BinderException("Trying to call function \"%s\" which is present in extension \"%s\" - but the extension "
		                      "is not loaded and could not be auto-loaded",
		                      bound_function.name, extension_name);
	}
	// auto-load the extension
	ExtensionHelper::AutoLoadExtension(db, extension_name);

	// now find the function in the catalog
	auto &catalog = Catalog::GetSystemCatalog(db);
	auto &function_entry = catalog.GetEntry<ScalarFunctionCatalogEntry>(context, DEFAULT_SCHEMA, bound_function.name);
	// override the function with the extension function
	bound_function = function_entry.functions.GetFunctionByArguments(context, bound_function.arguments);
	// call the original bind (if any)
	if (!bound_function.bind) {
		return nullptr;
	}
	return bound_function.bind(context, bound_function, arguments);
}